

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

void __thiscall covenant::CFGConnect::scc(CFGConnect *this,CFG *g)

{
  pointer pVVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  pointer pvVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  cleanup(this,(EVP_PKEY_CTX *)g);
  SCC_Init(this,g);
  SCC_Compute(this,(int)((ulong)((long)(this->verts).
                                       super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->verts).
                                      super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333
                   + -1);
  pVVar1 = (this->verts).
           super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->verts).
  super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVVar1 + -1;
  piVar2 = pVVar1[-1].edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pvVar5 = (this->groups).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->groups).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar5 + -1;
  piVar2 = pvVar5[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pvVar5 = (this->groups).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->groups).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      piVar2 = pvVar5[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = pvVar5[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar2 != piVar3) {
        uVar6 = (long)piVar3 - (long)piVar2 >> 2;
        lVar4 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar2,piVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar2,piVar3);
      }
      pvVar5 = (this->groups).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->groups).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
              -0x5555555555555555;
      bVar8 = uVar7 <= uVar6;
      lVar4 = uVar6 - uVar7;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar8 && lVar4 != 0);
  }
  return;
}

Assistant:

void scc(CFG& g){
      cleanup();
      SCC_Init(g);
      SCC_Compute(verts.size()-1);
      
      // Eliminate the fake vertex.
      verts.pop_back();
      groups.pop_back();

      // Sort to make queries more efficient
      for (unsigned int i=0; i < groups.size(); i++){
	sort(groups[i].begin(), groups[i].end());
      }
    }